

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

void __thiscall Image::save(Image *this,string *file_name)

{
  ostream *poVar1;
  long lVar2;
  size_t sVar3;
  ofstream out;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  std::ofstream::ofstream((ostream *)&local_220,(string *)file_name,_S_bin);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_220,"P6 ",3);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&local_220);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  sVar3 = this->height;
  if (sVar3 != 0) {
    lVar2 = sVar3 * 3;
    do {
      lVar2 = lVar2 + -3;
      std::ostream::write((char *)&local_220,
                          (long)((this->data)._M_t.
                                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                 .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                                this->width * lVar2));
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
  }
  local_220 = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void save(const std::string& file_name) {
        std::ofstream out(file_name, std::ofstream::binary);
        out << "P6 " << width << " " << height << " " << 255 << "\n";
        for (size_t j = height; j > 0; --j)
            out.write(reinterpret_cast<char*>(data.get() + (j - 1) * 3 * width), sizeof(uint8_t) * 3 * width);
    }